

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListViewPrivate::prepareItemsLayout(QListViewPrivate *this)

{
  bool bVar1;
  int iVar2;
  QListView *pQVar3;
  QStyle *pQVar4;
  QListViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int rowCount;
  int horizontalMargin;
  int verticalMargin;
  int frameAroundContents;
  QListView *q;
  QStyleOption option;
  QWidget *in_stack_ffffffffffffff18;
  QListViewPrivate *in_stack_ffffffffffffff20;
  QAbstractItemModel *pQVar5;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  uint uVar6;
  QWidget *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  QPersistentModelIndex local_98 [3];
  QPersistentModelIndex local_80 [3];
  QSize local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  clear(in_stack_ffffffffffffff20);
  QPoint::QPoint((QPoint *)in_stack_ffffffffffffff20);
  local_68 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)in_RDI);
  QRect::QRect((QRect *)in_RDI,
               (QPoint *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (QSize *)in_stack_ffffffffffffff30);
  (in_RDI->layoutBounds).x1 = (Representation)(undefined4)local_58;
  (in_RDI->layoutBounds).y1 = (Representation)local_58._4_4_;
  (in_RDI->layoutBounds).x2 = (Representation)(undefined4)local_50;
  (in_RDI->layoutBounds).y2 = (Representation)local_50._4_4_;
  pQVar4 = QWidget::style(in_stack_ffffffffffffff18);
  iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x11,0,pQVar3);
  if (iVar2 != 0) {
    memset(local_48,0xaa,0x40);
    QStyleOption::QStyleOption
              ((QStyleOption *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30);
    QStyleOption::initFrom
              ((QStyleOption *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff30);
    pQVar4 = QWidget::style(in_stack_ffffffffffffff18);
    (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,5,local_48,pQVar3);
    QStyleOption::~QStyleOption((QStyleOption *)in_stack_ffffffffffffff20);
  }
  if (((in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbarpolicy ==
       ScrollBarAsNeeded) &&
     ((in_RDI->flow == LeftToRight || (bVar1 = QWidget::isVisible((QWidget *)0x87fc1c), bVar1)))) {
    pQVar4 = QWidget::style(in_stack_ffffffffffffff18);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))
                      (pQVar4,0x56,0,
                       (in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                       vbar);
    if (iVar2 == 0) {
      pQVar4 = QWidget::style(in_stack_ffffffffffffff18);
      (**(code **)(*(long *)pQVar4 + 0xe0))
                (pQVar4,9,0,
                 (in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar);
    }
  }
  if ((in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbarpolicy ==
      ScrollBarAsNeeded) {
    pQVar4 = QWidget::style(in_stack_ffffffffffffff18);
    (**(code **)(*(long *)pQVar4 + 0xe0))
              (pQVar4,9,0,
               (in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar);
  }
  QRect::adjust((QRect *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                (int)in_stack_ffffffffffffff20);
  pQVar5 = (in_RDI->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_80);
  iVar2 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,local_80);
  if (iVar2 < 1) {
    uVar6 = 0;
  }
  else {
    pQVar5 = (in_RDI->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_98);
    uVar6 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,local_98);
  }
  (*in_RDI->commonListView->_vptr_QCommonListViewBase[6])(in_RDI->commonListView,(ulong)uVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListViewPrivate::prepareItemsLayout()
{
    Q_Q(QListView);
    clear();

    //take the size as if there were scrollbar in order to prevent scrollbar to blink
    layoutBounds = QRect(QPoint(), q->maximumViewportSize());

    int frameAroundContents = 0;
    if (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q)) {
        QStyleOption option;
        option.initFrom(q);
        frameAroundContents = q->style()->pixelMetric(QStyle::PM_DefaultFrameWidth, &option, q) * 2;
    }

    // maximumViewportSize() already takes scrollbar into account if policy is
    // Qt::ScrollBarAlwaysOn but scrollbar extent must be deduced if policy
    // is Qt::ScrollBarAsNeeded
    int verticalMargin = (vbarpolicy == Qt::ScrollBarAsNeeded) && (flow == QListView::LeftToRight || vbar->isVisible())
                        && !q->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, nullptr, vbar)
        ? q->style()->pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, vbar) + frameAroundContents
        : 0;
    int horizontalMargin =  hbarpolicy==Qt::ScrollBarAsNeeded
        ? q->style()->pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, hbar) + frameAroundContents
        : 0;

    layoutBounds.adjust(0, 0, -verticalMargin, -horizontalMargin);

    int rowCount = model->columnCount(root) <= 0 ? 0 : model->rowCount(root);
    commonListView->setRowCount(rowCount);
}